

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O2

void idx2::Copy<float>(grid *SGrid,volume *SVol,volume *DVol)

{
  grid_iterator<float> DIt;
  grid_iterator<float> SEnd;
  grid_iterator<float> SIt;
  grid_iterator<float> local_c8;
  grid_iterator<float> local_90;
  grid_iterator<float> local_58;
  
  Begin<float>(&local_58,SGrid,SVol);
  End<float>(&local_90,SGrid,SVol);
  Begin<float>(&local_c8,SGrid,DVol);
  while (local_58.Ptr != local_90.Ptr) {
    *local_c8.Ptr = *local_58.Ptr;
    grid_iterator<float>::operator++(&local_58);
    grid_iterator<float>::operator++(&local_c8);
  }
  return;
}

Assistant:

void
Copy(const grid& SGrid, const volume& SVol, volume* DVol)
{
  idx2_Assert(Dims(SGrid) <= Dims(*DVol));
  idx2_Assert(Dims(SGrid) <= Dims(SVol));
  idx2_Assert(DVol->Buffer && SVol.Buffer);
  idx2_Assert(SVol.Type == DVol->Type);

  auto SIt = Begin<t>(SGrid, SVol), SEnd = End<t>(SGrid, SVol);
  auto DIt = Begin<t>(SGrid, *DVol);
  for (; SIt != SEnd; ++SIt, ++DIt)
    *DIt = *SIt;
}